

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_helpers.h
# Opt level: O0

void highwayhash::UpdateState<highwayhash::SipHashStateT<2,4>>
               (char *bytes,HH_U64 size,SipHashStateT<2,_4> *state)

{
  ulong uVar1;
  ulong local_40;
  size_t i;
  size_t truncated_size;
  size_t remainder;
  int kPacketSize;
  SipHashStateT<2,_4> *state_local;
  HH_U64 size_local;
  char *bytes_local;
  
  uVar1 = size - (size & 7);
  for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 8) {
    SipHashStateT<2,_4>::Update(state,bytes + local_40);
  }
  PaddedUpdate<highwayhash::SipHashStateT<2,4>>(size,bytes + uVar1,size & 7,state);
  return;
}

Assistant:

HH_INLINE void UpdateState(const char* bytes, const HH_U64 size, State* state) {
  // Feed entire packets.
  const int kPacketSize = State::kPacketSize;
  static_assert((kPacketSize & (kPacketSize - 1)) == 0, "Size must be 2^i.");
  const size_t remainder = size & (kPacketSize - 1);
  const size_t truncated_size = size - remainder;
  for (size_t i = 0; i < truncated_size; i += kPacketSize) {
    state->Update(bytes + i);
  }

  PaddedUpdate(size, bytes + truncated_size, remainder, state);
}